

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O0

void __thiscall
TTD::ThreadContextTTD::ForceSetRootInfoInRestore
          (ThreadContextTTD *this,TTD_LOG_PTR_ID logid,RecyclableObject *obj,bool maybeLongLived)

{
  BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_00;
  bool local_21;
  RecyclableObject *pRStack_20;
  bool maybeLongLived_local;
  RecyclableObject *obj_local;
  TTD_LOG_PTR_ID logid_local;
  ThreadContextTTD *this_local;
  
  local_21 = maybeLongLived;
  pRStack_20 = obj;
  obj_local = (RecyclableObject *)logid;
  logid_local = (TTD_LOG_PTR_ID)this;
  JsUtil::
  BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Item(&this->m_ttdRootTagToObjectMap,(unsigned_long *)&obj_local,&stack0xffffffffffffffe0);
  if ((local_21 & 1U) != 0) {
    JsUtil::
    BaseDictionary<unsigned_long,_bool,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Item(&this->m_ttdMayBeLongLivedRoot,(unsigned_long *)&obj_local,&local_21);
  }
  this_00 = Memory::
            RecyclerRootPtr<JsUtil::BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
            ::operator->(&this->m_ttdReplayRootPinSet);
  JsUtil::
  BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::AddNew(this_00,&stack0xffffffffffffffe0);
  return;
}

Assistant:

void ThreadContextTTD::ForceSetRootInfoInRestore(TTD_LOG_PTR_ID logid, Js::RecyclableObject* obj, bool maybeLongLived)
    {
        this->m_ttdRootTagToObjectMap.Item(logid, obj);
        if(maybeLongLived)
        {
            this->m_ttdMayBeLongLivedRoot.Item(logid, maybeLongLived);
        }

        this->m_ttdReplayRootPinSet->AddNew(obj);
    }